

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O1

bool slang::syntax::SyntaxFacts::isPossibleArgument(TokenKind kind)

{
  bool bVar1;
  int iVar2;
  undefined6 in_register_0000003a;
  
  iVar2 = (int)CONCAT62(in_register_0000003a,kind);
  if (iVar2 < 0xec) {
    if ((((iVar2 - 0xa3U < 0x40) &&
         ((0x8900000000080041U >> ((ulong)(iVar2 - 0xa3U) & 0x3f) & 1) != 0)) ||
        ((iVar2 - 0x5dU < 0x30 && ((0x800000400005U >> ((ulong)(iVar2 - 0x5dU) & 0x3f) & 1) != 0))))
       || (iVar2 - 0x18U < 2)) {
      return true;
    }
  }
  else {
    if ((iVar2 - 0xecU < 0x3b) && ((0x604000700400001U >> ((ulong)(iVar2 - 0xecU) & 0x3f) & 1) != 0)
       ) {
      return true;
    }
    if (iVar2 == 0x14a) {
      return true;
    }
  }
  bVar1 = isPossibleExpression(kind);
  return bVar1;
}

Assistant:

bool SyntaxFacts::isPossibleArgument(TokenKind kind) {
    // allow a comma here to handle cases like:  foo(, 3);
    switch (kind) {
        case TokenKind::Dot:
        case TokenKind::Comma:
        case TokenKind::FirstMatchKeyword:
        case TokenKind::StrongKeyword:
        case TokenKind::WeakKeyword:
        case TokenKind::NotKeyword:
        case TokenKind::IfKeyword:
        case TokenKind::CaseKeyword:
        case TokenKind::NextTimeKeyword:
        case TokenKind::SNextTimeKeyword:
        case TokenKind::AlwaysKeyword:
        case TokenKind::SAlwaysKeyword:
        case TokenKind::EventuallyKeyword:
        case TokenKind::SEventuallyKeyword:
        case TokenKind::AcceptOnKeyword:
        case TokenKind::SyncAcceptOnKeyword:
        case TokenKind::RejectOnKeyword:
        case TokenKind::SyncRejectOnKeyword:
        case TokenKind::EdgeKeyword:
        case TokenKind::PosEdgeKeyword:
        case TokenKind::NegEdgeKeyword:
            return true;
        default:
            return isPossibleExpression(kind);
    }
}